

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

any __thiscall
cs_impl::
cni_helper<cs_impl::any(*)(cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&),cs_impl::any(*)(cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)>
::_call<0,1>(cni_helper<cs_impl::any(*)(cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&),cs_impl::any(*)(cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)>
             *this,vector *args,sequence<0,_1> *param_2)

{
  long lVar1;
  proxy *in_RAX;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar2;
  any local_28;
  
  lVar1 = *(long *)param_2;
  local_28.mDat = in_RAX;
  pdVar2 = try_convert_and_check<const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_1UL>
           ::convert((var *)(lVar1 + 8));
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)args[1].super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
              super__Vector_impl_data._M_start)(&local_28,args,lVar1,pdVar2);
    *(undefined8 *)this = 0;
    *(proxy **)this = local_28.mDat;
    local_28.mDat = (proxy *)0x0;
    any::recycle(&local_28);
    return (any)(proxy *)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}